

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::lts_20240722::Cord::SetCrcCordState(Cord *this,CrcCordState *state)

{
  char cVar1;
  undefined8 uVar2;
  CordzUpdateScope CVar3;
  CordRepFlat *pCVar4;
  CordRep *pCVar5;
  long *plVar6;
  CordzInfo *pCVar7;
  long lVar8;
  ulong len;
  CordzUpdateScope scope;
  CrcCordState local_40 [8];
  CordzUpdateScope local_38;
  CrcCordState local_30 [8];
  CrcCordState local_28 [8];
  
  cVar1 = (this->contents_).data_.rep_.field_0.data[0];
  if (((long)cVar1 & 1U) == 0) {
    if (cVar1 != '\0') {
      len = (ulong)(long)cVar1 >> 1;
      pCVar4 = cord_internal::CordRepFlat::NewImpl<4096ul>(len);
      (pCVar4->super_CordRep).length = len;
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
        __assert_fail("!is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x27f,
                      "void absl::cord_internal::InlineData::copy_max_inline_to(char *) const");
      }
      uVar2 = *(undefined8 *)((long)&(this->contents_).data_.rep_.field_0.as_tree.cordz_info + 1);
      *(CordRep **)((long)&pCVar4[1].super_CordRep.length + 4) =
           (this->contents_).data_.rep_.field_0.as_tree.rep;
      *(undefined8 *)(pCVar4->super_CordRep).storage = uVar2;
      absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_30,state);
      pCVar5 = (CordRep *)absl::lts_20240722::cord_internal::CordRepCrc::New(pCVar4,local_30);
      absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(local_30);
      if (pCVar5 == (CordRep *)0x0) goto LAB_0010d2ff;
      (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar5;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
      plVar6 = (long *)__tls_get_addr(&PTR_0011cfd0);
      lVar8 = *plVar6;
      if (lVar8 < 2) {
        SetCrcCordState();
        return;
      }
      goto LAB_0010d2af;
    }
  }
  else {
    pCVar5 = (this->contents_).data_.rep_.field_0.as_tree.rep;
    if (pCVar5->length != 0) {
      local_38.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
      if (local_38.info_ != (CordzInfo *)0x0) {
        absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_38.info_);
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x272,"CordRep *absl::cord_internal::InlineData::as_tree() const");
      }
      pCVar5 = (this->contents_).data_.rep_.field_0.as_tree.rep;
      absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_40,state);
      pCVar5 = (CordRep *)absl::lts_20240722::cord_internal::CordRepCrc::New(pCVar5,local_40);
      absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(local_40);
      CVar3.info_ = local_38.info_;
      if (pCVar5 == (CordRep *)0x0) {
        __assert_fail("rep",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x500,
                      "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar5;
        if (local_38.info_ != (CordzInfo *)0x0) {
          absl::lts_20240722::Mutex::AssertHeld();
          *(CordRep **)(CVar3.info_ + 0x40) = pCVar5;
        }
        cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_38);
        return;
      }
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x501,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if (pCVar5->tag != '\x02') {
      __assert_fail("rep->IsCrc()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x531,"void absl::Cord::InlineRep::MaybeRemoveEmptyCrcNode()");
    }
    if (pCVar5[1].length != 0) {
      __assert_fail("rep->crc()->child == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x532,"void absl::Cord::InlineRep::MaybeRemoveEmptyCrcNode()");
    }
    pCVar7 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (pCVar7 != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Untrack();
    }
    cord_internal::CordRep::Unref(pCVar5);
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  }
  absl::lts_20240722::crc_internal::CrcCordState::CrcCordState(local_28,state);
  pCVar5 = (CordRep *)absl::lts_20240722::cord_internal::CordRepCrc::New(0,local_28);
  absl::lts_20240722::crc_internal::CrcCordState::~CrcCordState(local_28);
  if (pCVar5 == (CordRep *)0x0) {
LAB_0010d2ff:
    __assert_fail("rep",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                  ,0x4f2,
                  "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                 );
  }
  (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar5;
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
  plVar6 = (long *)__tls_get_addr(&PTR_0011cfd0);
  lVar8 = *plVar6;
  if (lVar8 < 2) {
    SetCrcCordState();
    return;
  }
LAB_0010d2af:
  *plVar6 = lVar8 + -1;
  return;
}

Assistant:

void Cord::SetCrcCordState(crc_internal::CrcCordState state) {
  auto constexpr method = CordzUpdateTracker::kSetExpectedChecksum;
  if (empty()) {
    contents_.MaybeRemoveEmptyCrcNode();
    CordRep* rep = CordRepCrc::New(nullptr, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else if (!contents_.is_tree()) {
    CordRep* rep = contents_.MakeFlatWithExtraCapacity(0);
    rep = CordRepCrc::New(rep, std::move(state));
    contents_.EmplaceTree(rep, method);
  } else {
    const CordzUpdateScope scope(contents_.data_.cordz_info(), method);
    CordRep* rep = CordRepCrc::New(contents_.data_.as_tree(), std::move(state));
    contents_.SetTree(rep, scope);
  }
}